

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

void BN_consttime_swap(unsigned_long condition,BIGNUM *a,BIGNUM *b,int nwords)

{
  ulong uVar1;
  ulong uVar2;
  int i;
  unsigned_long t;
  int nwords_local;
  BIGNUM *b_local;
  BIGNUM *a_local;
  unsigned_long condition_local;
  
  uVar1 = 0xffffffffffffffff - ((long)(condition - 1) >> 0x3f);
  t._0_4_ = (a->top ^ b->top) & (uint)uVar1;
  a->top = a->top ^ (uint)t;
  b->top = b->top ^ (uint)t;
  switch(nwords) {
  default:
    for (i = 10; i < nwords; i = i + 1) {
      uVar2 = (a->d[i] ^ b->d[i]) & uVar1;
      a->d[i] = uVar2 ^ a->d[i];
      b->d[i] = uVar2 ^ b->d[i];
    }
  case 10:
    uVar2 = (a->d[9] ^ b->d[9]) & uVar1;
    a->d[9] = uVar2 ^ a->d[9];
    b->d[9] = uVar2 ^ b->d[9];
  case 9:
    uVar2 = (a->d[8] ^ b->d[8]) & uVar1;
    a->d[8] = uVar2 ^ a->d[8];
    b->d[8] = uVar2 ^ b->d[8];
  case 8:
    uVar2 = (a->d[7] ^ b->d[7]) & uVar1;
    a->d[7] = uVar2 ^ a->d[7];
    b->d[7] = uVar2 ^ b->d[7];
  case 7:
    uVar2 = (a->d[6] ^ b->d[6]) & uVar1;
    a->d[6] = uVar2 ^ a->d[6];
    b->d[6] = uVar2 ^ b->d[6];
  case 6:
    uVar2 = (a->d[5] ^ b->d[5]) & uVar1;
    a->d[5] = uVar2 ^ a->d[5];
    b->d[5] = uVar2 ^ b->d[5];
  case 5:
    uVar2 = (a->d[4] ^ b->d[4]) & uVar1;
    a->d[4] = uVar2 ^ a->d[4];
    b->d[4] = uVar2 ^ b->d[4];
  case 4:
    uVar2 = (a->d[3] ^ b->d[3]) & uVar1;
    a->d[3] = uVar2 ^ a->d[3];
    b->d[3] = uVar2 ^ b->d[3];
  case 3:
    uVar2 = (a->d[2] ^ b->d[2]) & uVar1;
    a->d[2] = uVar2 ^ a->d[2];
    b->d[2] = uVar2 ^ b->d[2];
  case 2:
    uVar2 = (a->d[1] ^ b->d[1]) & uVar1;
    a->d[1] = uVar2 ^ a->d[1];
    b->d[1] = uVar2 ^ b->d[1];
  case 1:
    uVar1 = (*a->d ^ *b->d) & uVar1;
    *a->d = uVar1 ^ *a->d;
    *b->d = uVar1 ^ *b->d;
    return;
  }
}

Assistant:

void BN_consttime_swap(BN_ULONG condition, BIGNUM *a, BIGNUM *b, int nwords)
{
    BN_ULONG t;
    int i;

    bn_wcheck_size(a, nwords);
    bn_wcheck_size(b, nwords);

    assert(a != b);
    assert((condition & (condition - 1)) == 0);
    assert(sizeof(BN_ULONG) >= sizeof(int));

    condition = ((condition - 1) >> (BN_BITS2 - 1)) - 1;

    t = (a->top ^ b->top) & condition;
    a->top ^= t;
    b->top ^= t;

#define BN_CONSTTIME_SWAP(ind) \
        do { \
                t = (a->d[ind] ^ b->d[ind]) & condition; \
                a->d[ind] ^= t; \
                b->d[ind] ^= t; \
        } while (0)

    switch (nwords) {
    default:
        for (i = 10; i < nwords; i++)
            BN_CONSTTIME_SWAP(i);
        /* Fallthrough */
    case 10:
        BN_CONSTTIME_SWAP(9);   /* Fallthrough */
    case 9:
        BN_CONSTTIME_SWAP(8);   /* Fallthrough */
    case 8:
        BN_CONSTTIME_SWAP(7);   /* Fallthrough */
    case 7:
        BN_CONSTTIME_SWAP(6);   /* Fallthrough */
    case 6:
        BN_CONSTTIME_SWAP(5);   /* Fallthrough */
    case 5:
        BN_CONSTTIME_SWAP(4);   /* Fallthrough */
    case 4:
        BN_CONSTTIME_SWAP(3);   /* Fallthrough */
    case 3:
        BN_CONSTTIME_SWAP(2);   /* Fallthrough */
    case 2:
        BN_CONSTTIME_SWAP(1);   /* Fallthrough */
    case 1:
        BN_CONSTTIME_SWAP(0);
    }
#undef BN_CONSTTIME_SWAP
}